

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::OBJMaterial> *material,ssize_t id)

{
  int in_EDX;
  int __oflag;
  long *in_RSI;
  XMLWriter *in_RDI;
  shared_ptr<embree::Texture> *in_stack_fffffffffffffdf8;
  allocator *paVar1;
  Vec3fa *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  XMLWriter *in_stack_fffffffffffffe10;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [16];
  shared_ptr<embree::Texture> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  XMLWriter *in_stack_fffffffffffffeb0;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [55];
  allocator local_a1;
  string local_a0 [32];
  int local_80;
  
  local_80 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"material",&local_a1);
  std::__cxx11::string::string(local_d8,(string *)(*in_RSI + 0x30));
  open(in_RDI,(char *)local_a0,local_80,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  store(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"parameters",&local_f9);
  open(in_RDI,(char *)local_f8,__oflag);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  store_parm(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(float *)in_stack_fffffffffffffe00)
  ;
  store_parm(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  store_parm(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  store_parm(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  store_parm(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  store_parm(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(float *)in_stack_fffffffffffffe00)
  ;
  store_parm(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(float *)in_stack_fffffffffffffe00)
  ;
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  store_parm(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3ef891);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  store_parm(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3ef8e7);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  store_parm(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3ef93d);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  store_parm(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3ef993);
  std::shared_ptr<embree::Texture>::shared_ptr
            ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  store_parm(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3ef9e9);
  paVar1 = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"parameters",paVar1);
  close(in_RDI,(int)local_170);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  paVar1 = &local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"material",paVar1);
  close(in_RDI,(int)local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  return;
}

Assistant:

void XMLWriter::store(Ref<OBJMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","OBJ");
    open("parameters");
    store_parm("d",material->d);
    store_parm("Ka",material->Ka);
    store_parm("Kd",material->Kd);
    store_parm("Ks",material->Ks);
    store_parm("Kt",material->Kt);
    store_parm("Ns",material->Ns);
    store_parm("Ni",material->Ni);
    store_parm("map_d",material->_map_d);
    store_parm("map_Kd",material->_map_Kd);
    store_parm("map_Ks",material->_map_Ks);
    store_parm("map_Ns",material->_map_Ns);
    store_parm("map_Displ",material->_map_Displ);
    close("parameters");
    close("material");
  }